

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_strategy.cpp
# Opt level: O2

FUNCTION_RETURN __thiscall
license::hw_identifier::DefaultStrategy::generate_pc_id(DefaultStrategy *this,HwIdentifier *pc_id)

{
  FUNCTION_RETURN FVar1;
  pointer *__ptr;
  pointer pLVar2;
  IdentificationStrategy local_48;
  vector<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
  strategy_to_try;
  
  available_strategies();
  FVar1 = FUNC_RET_NOT_AVAIL;
  pLVar2 = strategy_to_try.
           super__Vector_base<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pLVar2 == strategy_to_try.
                  super__Vector_base<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
                  ._M_impl.super__Vector_impl_data._M_finish) goto LAB_001984d9;
    IdentificationStrategy::get_strategy(&local_48,*pLVar2);
    FVar1 = (**(code **)(*local_48._vptr_IdentificationStrategy + 0x18))
                      (local_48._vptr_IdentificationStrategy,pc_id);
    if (local_48._vptr_IdentificationStrategy != (_func_int **)0x0) {
      (**(code **)(*local_48._vptr_IdentificationStrategy + 8))();
    }
    pLVar2 = pLVar2 + 1;
  } while (FVar1 != FUNC_RET_OK);
  FVar1 = FUNC_RET_OK;
LAB_001984d9:
  std::
  _Vector_base<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
  ::~_Vector_base(&strategy_to_try.
                   super__Vector_base<LCC_API_HW_IDENTIFICATION_STRATEGY,_std::allocator<LCC_API_HW_IDENTIFICATION_STRATEGY>_>
                 );
  return FVar1;
}

Assistant:

FUNCTION_RETURN DefaultStrategy::generate_pc_id(HwIdentifier& pc_id) const {
	vector<LCC_API_HW_IDENTIFICATION_STRATEGY> strategy_to_try = available_strategies();
	FUNCTION_RETURN ret = FUNC_RET_NOT_AVAIL;
	for (auto it : strategy_to_try) {
		LCC_API_HW_IDENTIFICATION_STRATEGY strat_to_try = it;
		unique_ptr<IdentificationStrategy> strategy_ptr = IdentificationStrategy::get_strategy(strat_to_try);
		ret = strategy_ptr->generate_pc_id(pc_id);
		if (ret == FUNC_RET_OK) {
			break;
		}
	}
	return ret;
}